

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O2

Node48 * duckdb::Node48::GrowNode16(ART *art,Node *node48,Node *node16)

{
  uint8_t i;
  Node16 *pNVar1;
  Node48 *pNVar2;
  long lVar3;
  ulong uVar4;
  uint8_t i_1;
  ulong uVar5;
  
  pNVar1 = Node::Ref<duckdb::Node16>(art,(Node)(node16->super_IndexPointer).data,NODE_16);
  pNVar2 = New(art,node48);
  Node::SetGateStatus(node48,(GateStatus)((node16->super_IndexPointer).data >> 0x3f));
  pNVar2->count = (pNVar1->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count;
  for (lVar3 = 1; lVar3 != 0x101; lVar3 = lVar3 + 1) {
    pNVar2->child_index[lVar3 + -1] = '0';
  }
  for (uVar4 = 0;
      uVar5 = (ulong)(pNVar1->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count,
      uVar4 < uVar5; uVar4 = uVar4 + 1) {
    pNVar2->child_index
    [(pNVar1->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).key[uVar4]] = (uint8_t)uVar4;
    pNVar2->children[uVar4].super_IndexPointer.data =
         (pNVar1->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).children[uVar4].
         super_IndexPointer.data;
  }
  for (; uVar5 < 0x30; uVar5 = uVar5 + 1) {
    pNVar2->children[uVar5].super_IndexPointer.data = 0;
  }
  (pNVar1->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count = '\0';
  Node::Free(art,node16);
  return pNVar2;
}

Assistant:

Node48 &Node48::GrowNode16(ART &art, Node &node48, Node &node16) {
	auto &n16 = Node::Ref<Node16>(art, node16, NType::NODE_16);
	auto &n48 = New(art, node48);
	node48.SetGateStatus(node16.GetGateStatus());

	n48.count = n16.count;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		n48.child_index[i] = EMPTY_MARKER;
	}
	for (uint8_t i = 0; i < n16.count; i++) {
		n48.child_index[n16.key[i]] = i;
		n48.children[i] = n16.children[i];
	}
	for (uint8_t i = n16.count; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	n16.count = 0;
	Node::Free(art, node16);
	return n48;
}